

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

void __thiscall
glu::VariableDeclaration::VariableDeclaration
          (VariableDeclaration *this,VarType *varType_,string *name_,Storage storage_,
          Interpolation interpolation_,Layout *layout_,deUint32 memoryAccessQualifierBits_)

{
  int iVar1;
  int iVar2;
  FormatLayout FVar3;
  Layout *layout__local;
  Interpolation interpolation__local;
  Storage storage__local;
  string *name__local;
  VarType *varType__local;
  VariableDeclaration *this_local;
  
  (this->layout).matrixOrder = layout_->matrixOrder;
  iVar1 = layout_->binding;
  iVar2 = layout_->offset;
  FVar3 = layout_->format;
  (this->layout).location = layout_->location;
  (this->layout).binding = iVar1;
  (this->layout).offset = iVar2;
  (this->layout).format = FVar3;
  this->interpolation = interpolation_;
  this->storage = storage_;
  VarType::VarType(&this->varType,varType_);
  this->memoryAccessQualifierBits = memoryAccessQualifierBits_;
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  return;
}

Assistant:

VariableDeclaration::VariableDeclaration (const VarType& varType_, const std::string& name_, Storage storage_, Interpolation interpolation_, const Layout& layout_, deUint32 memoryAccessQualifierBits_)
	: layout						(layout_)
	, interpolation					(interpolation_)
	, storage						(storage_)
	, varType						(varType_)
	, memoryAccessQualifierBits		(memoryAccessQualifierBits_)
	, name							(name_)
{
}